

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.cc
# Opt level: O0

int64_t __thiscall brown::MySimulator::linearSpeedCurve(MySimulator *this,int64_t tt)

{
  int iVar1;
  long local_20;
  int64_t vt;
  int64_t tt_local;
  MySimulator *this_local;
  
  if (linearSpeedCurve(long)::r2 == '\0') {
    iVar1 = __cxa_guard_acquire(&linearSpeedCurve(long)::r2);
    if (iVar1 != 0) {
      linearSpeedCurve::r2 = (this->super_Simulator).CLKFRQ * (this->super_Simulator).CLKFRQ;
      __cxa_guard_release(&linearSpeedCurve(long)::r2);
    }
  }
  if (linearSpeedCurve(long)::rv0 == '\0') {
    iVar1 = __cxa_guard_acquire(&linearSpeedCurve(long)::rv0);
    if (iVar1 != 0) {
      linearSpeedCurve::rv0 = (this->super_Simulator).CLKFRQ * (long)(this->super_Simulator).MINVEL;
      __cxa_guard_release(&linearSpeedCurve(long)::rv0);
    }
  }
  if (linearSpeedCurve(long)::a == '\0') {
    iVar1 = __cxa_guard_acquire(&linearSpeedCurve(long)::a);
    if (iVar1 != 0) {
      linearSpeedCurve::a = (int64_t)(((this->super_Simulator).MAXACC << 2) / 5);
      __cxa_guard_release(&linearSpeedCurve(long)::a);
    }
  }
  if (linearSpeedCurve(long)::lt == '\0') {
    iVar1 = __cxa_guard_acquire(&linearSpeedCurve(long)::lt);
    if (iVar1 != 0) {
      linearSpeedCurve::lt = (int64_t)((this->super_Simulator).MAXT << 1);
      __cxa_guard_release(&linearSpeedCurve(long)::lt);
    }
  }
  if (tt < linearSpeedCurve::lt) {
    local_20 = (long)(this->super_Simulator).MAXT;
  }
  else {
    local_20 = linearSpeedCurve::r2 /
               (linearSpeedCurve::rv0 + linearSpeedCurve::a * (tt - linearSpeedCurve::lt));
  }
  return local_20;
}

Assistant:

std::int64_t MySimulator::linearSpeedCurve(std::int64_t tt) {
    static std::int64_t r2 = CLKFRQ * CLKFRQ;
    static std::int64_t rv0 = CLKFRQ * MINVEL;
    static std::int64_t a = MAXACC*4/5;
    static std::int64_t lt = MAXT*2; // low speed period

    std::int64_t vt = 0;
    if (tt < lt) {
        vt = MAXT;
    } else {
        vt = r2/(rv0 + a*(tt-lt));
    }
    return vt;
}